

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2dPoint * __thiscall ON_2dPoint::operator=(ON_2dPoint *this,float *p)

{
  ON_2dPoint OVar1;
  double dVar2;
  double dVar3;
  
  if (p == (float *)0x0) {
    dVar2 = 0.0;
    dVar3 = 0.0;
  }
  else {
    dVar2 = (double)(float)*(undefined8 *)p;
    dVar3 = (double)(float)((ulong)*(undefined8 *)p >> 0x20);
  }
  OVar1.y._0_4_ = SUB84(dVar3,0);
  OVar1.x = dVar2;
  OVar1.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
  *this = OVar1;
  return this;
}

Assistant:

ON_2dPoint& ON_2dPoint::operator=(const float* p)
{
  if ( p ) {
    x = (double)p[0];
    y = (double)p[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}